

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdflib.cpp
# Opt level: O0

double apser(double *a,double *b,double *x,double *eps)

{
  double dVar1;
  double dVar2;
  double *eps_local;
  double *x_local;
  double *b_local;
  double *a_local;
  
  apser::bx = *b * *x;
  apser::t = *x - apser::bx;
  if (*b * *eps <= 0.02) {
    dVar2 = log(*x);
    dVar1 = psi(b);
    apser::c = dVar2 + dVar1 + apser::g + apser::t;
  }
  else {
    dVar2 = log(apser::bx);
    apser::c = dVar2 + apser::g + apser::t;
  }
  apser::tol = *eps * 5.0 * ABS(apser::c);
  apser::j = 1.0;
  apser::s = 0.0;
  do {
    apser::j = apser::j + 1.0;
    apser::t = apser::t * (*x - apser::bx / apser::j);
    apser::aj = apser::t / apser::j;
    apser::s = apser::s + apser::aj;
  } while (apser::tol < ABS(apser::aj));
  apser::apser = -(*a * (apser::c + apser::s));
  return apser::apser;
}

Assistant:

double apser ( double *a, double *b, double *x, double *eps )

//****************************************************************************80
//
//  Purpose:
//
//    APSER computes the incomplete beta ratio I(SUB(1-X))(B,A).
//
//  Discussion:
//
//    APSER is used only for cases where
//
//      A <= min ( EPS, EPS * B ),
//      B * X <= 1, and
//      X <= 0.5.
//
//  Parameters:
//
//    Input, double *A, *B, *X, the parameters of teh
//    incomplete beta ratio.
//
//    Input, double *EPS, a tolerance.
//
//    Output, double APSER, the computed value of the
//    incomplete beta ratio.
//
{
  static double g = 0.577215664901533e0;
  static double apser,aj,bx,c,j,s,t,tol;

    bx = *b**x;
    t = *x-bx;
    if(*b**eps > 2.e-2) goto S10;
    c = log(*x)+psi(b)+g+t;
    goto S20;
S10:
    c = log(bx)+g+t;
S20:
    tol = 5.0e0**eps*fabs(c);
    j = 1.0e0;
    s = 0.0e0;
S30:
    j = j + 1.0e0;
    t = t * (*x-bx/j);
    aj = t/j;
    s = s + aj;
    if(fabs(aj) > tol) goto S30;
    apser = -(*a*(c+s));
    return apser;
}